

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::mask_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          Image *mask)

{
  long y_00;
  runtime_error *this_00;
  long lVar1;
  long x_00;
  long x_01;
  bool bVar2;
  uint64_t r;
  Image *local_b0;
  uint64_t b;
  uint64_t g;
  ssize_t h_local;
  ssize_t w_local;
  long local_88;
  long local_80;
  ssize_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  uint64_t a;
  ssize_t y_local;
  ssize_t x_local;
  
  w_local = w;
  if (w < 0) {
    w_local = source->width;
  }
  h_local = h;
  if (h < 0) {
    h_local = source->height;
  }
  local_b0 = this;
  y_local = y;
  x_local = x;
  if (((ulong)w_local <= (ulong)mask->width) && ((ulong)h_local <= (ulong)mask->height)) {
    clamp_blit_dimensions(this,source,&x_local,&y_local,&w_local,&h_local,&sx,&sy);
    local_70 = sx;
    local_78 = sy;
    local_80 = x_local;
    local_58 = 0;
    local_68 = w_local;
    if (w_local < 1) {
      local_68 = local_58;
    }
    local_88 = y_local;
    local_60 = h_local;
    if (h_local < 1) {
      local_60 = local_58;
    }
    for (; local_58 != local_60; local_58 = local_58 + 1) {
      y_00 = local_78 + local_58;
      local_50 = local_88 + local_58;
      lVar1 = local_68;
      x_00 = local_70;
      x_01 = local_80;
      while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
        read_pixel(mask,x_00,y_00,&r,&g,&b,(uint64_t *)0x0);
        if (((r != 0xff) || (g != 0xff)) || (b != 0xff)) {
          read_pixel(source,x_00,y_00,&r,&g,&b,&a);
          write_pixel(local_b0,x_01,local_50,r,g,b,a);
        }
        x_00 = x_00 + 1;
        x_01 = x_01 + 1;
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"mask is too small to cover copied area");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Image::mask_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, const Image& mask) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  // The mask image must cover the entire area to be blitted, but it does NOT
  // have to cover the entire destination or source image. The mask is indexed
  // in source-space, though, so its upper-left corner must be aligned with the
  // source image's upper-left corner.
  if ((mask.get_width() < static_cast<size_t>(w)) ||
      (mask.get_height() < static_cast<size_t>(h))) {
    throw runtime_error("mask is too small to cover copied area");
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (ssize_t yy = 0; yy < h; yy++) {
    for (ssize_t xx = 0; xx < w; xx++) {
      uint64_t r, g, b, a;
      mask.read_pixel(sx + xx, sy + yy, &r, &g, &b);
      if (r == 0xFF && g == 0xFF && b == 0xFF) {
        continue;
      }
      source.read_pixel(sx + xx, sy + yy, &r, &g, &b, &a);
      this->write_pixel(x + xx, y + yy, r, g, b, a);
    }
  }
}